

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int coda_pcre2_substring_nametable_scan_8
              (pcre2_code_8 *code,PCRE2_SPTR8 stringname,PCRE2_SPTR8 *firstptr,PCRE2_SPTR8 *lastptr)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  pcre2_code_8 *ppVar4;
  uint8_t *puVar5;
  uint local_74;
  PCRE2_SPTR8 lastentry;
  PCRE2_SPTR8 last;
  PCRE2_SPTR8 first;
  int c;
  PCRE2_SPTR8 entry;
  uint16_t mid;
  PCRE2_SPTR8 nametable;
  uint16_t entrysize;
  uint16_t top;
  uint16_t bot;
  PCRE2_SPTR8 *lastptr_local;
  PCRE2_SPTR8 *firstptr_local;
  PCRE2_SPTR8 stringname_local;
  pcre2_code_8 *code_local;
  
  nametable._6_2_ = 0;
  uVar1 = code->name_entry_size;
  ppVar4 = code + 1;
  uVar2 = code->name_count;
  while( true ) {
    nametable._4_2_ = uVar2;
    if (nametable._4_2_ <= nametable._6_2_) {
      return -0x31;
    }
    uVar2 = (ushort)((ulong)((uint)nametable._4_2_ + (uint)nametable._6_2_) / 2);
    puVar5 = ppVar4->start_bitmap + (long)(int)((uint)uVar1 * (uint)uVar2) + -0x28;
    iVar3 = coda__pcre2_strcmp_8(stringname,puVar5 + 2);
    if (iVar3 == 0) break;
    if (0 < iVar3) {
      nametable._6_2_ = uVar2 + 1;
      uVar2 = nametable._4_2_;
    }
  }
  uVar2 = code->name_count;
  last = puVar5;
  while ((lastentry = puVar5, ppVar4 < last &&
         (iVar3 = coda__pcre2_strcmp_8(stringname,last + (2 - (long)(int)(uint)uVar1)), iVar3 == 0))
        ) {
    last = last + -(long)(int)(uint)uVar1;
  }
  while ((lastentry < ppVar4->start_bitmap + (long)(int)((uint)uVar1 * (uVar2 - 1)) + -0x28 &&
         (iVar3 = coda__pcre2_strcmp_8(stringname,lastentry + (long)(int)(uint)uVar1 + 2),
         iVar3 == 0))) {
    lastentry = lastentry + (int)(uint)uVar1;
  }
  if (firstptr == (PCRE2_SPTR8 *)0x0) {
    if (last == lastentry) {
      local_74 = (uint)CONCAT11(*puVar5,puVar5[1]);
    }
    else {
      local_74 = 0xffffffce;
    }
    return local_74;
  }
  *firstptr = last;
  *lastptr = lastentry;
  return (uint)uVar1;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_nametable_scan(const pcre2_code *code, PCRE2_SPTR stringname,
  PCRE2_SPTR *firstptr, PCRE2_SPTR *lastptr)
{
uint16_t bot = 0;
uint16_t top = code->name_count;
uint16_t entrysize = code->name_entry_size;
PCRE2_SPTR nametable = (PCRE2_SPTR)((char *)code + sizeof(pcre2_real_code));

while (top > bot)
  {
  uint16_t mid = (top + bot) / 2;
  PCRE2_SPTR entry = nametable + entrysize*mid;
  int c = PRIV(strcmp)(stringname, entry + IMM2_SIZE);
  if (c == 0)
    {
    PCRE2_SPTR first;
    PCRE2_SPTR last;
    PCRE2_SPTR lastentry;
    lastentry = nametable + entrysize * (code->name_count - 1);
    first = last = entry;
    while (first > nametable)
      {
      if (PRIV(strcmp)(stringname, (first - entrysize + IMM2_SIZE)) != 0) break;
      first -= entrysize;
      }
    while (last < lastentry)
      {
      if (PRIV(strcmp)(stringname, (last + entrysize + IMM2_SIZE)) != 0) break;
      last += entrysize;
      }
    if (firstptr == NULL) return (first == last)?
      (int)GET2(entry, 0) : PCRE2_ERROR_NOUNIQUESUBSTRING;
    *firstptr = first;
    *lastptr = last;
    return entrysize;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return PCRE2_ERROR_NOSUBSTRING;
}